

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classloader.cpp
# Opt level: O0

void __thiscall stackjit::ClassLoader::loadClasses(ClassLoader *this,ImageContainer *imageContainer)

{
  pointer imageContainer_00;
  anon_class_16_2_c33fdbcb local_60;
  function<void_(const_stackjit::Loader::Class_&)> local_50;
  undefined1 local_30 [8];
  vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> classes;
  ImageContainer *imageContainer_local;
  ClassLoader *this_local;
  
  classes.super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)imageContainer;
  std::vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>::vector
            ((vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> *)local_30);
  imageContainer_00 =
       classes.super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_60.imageContainer =
       (ImageContainer *)
       classes.super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_60.classes =
       (vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> *)local_30;
  std::function<void(stackjit::Loader::Class_const&)>::
  function<stackjit::ClassLoader::loadClasses(stackjit::ImageContainer&)::__0,void>
            ((function<void(stackjit::Loader::Class_const&)> *)&local_50,&local_60);
  anon_unknown_8::forEachClass((ImageContainer *)imageContainer_00,&local_50);
  std::function<void_(const_stackjit::Loader::Class_&)>::~function(&local_50);
  loadClasses(this,(vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> *)
                   local_30);
  std::vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>::~vector
            ((vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> *)local_30);
  return;
}

Assistant:

void ClassLoader::loadClasses(ImageContainer& imageContainer) {
		std::vector<Loader::Class> classes;
		forEachClass(imageContainer, [&](const stackjit::Loader::Class& classDef) {
			imageContainer.loadClassBody(classDef.name());
			classes.push_back(classDef);
		});

		loadClasses(classes);
	}